

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::ValueBuilder::appendToVar(ValueBuilder *this,Ref var,IString name,Ref value)

{
  char cVar1;
  Ref *this_00;
  Ref RVar2;
  Ref r;
  undefined8 *puVar3;
  undefined1 local_30 [8];
  IString name_local;
  Ref var_local;
  Ref value_local;
  
  var_local.inst = (Value *)name.str._M_str;
  name_local.str._M_len = name.str._M_len;
  local_30 = (undefined1  [8])var.inst;
  name_local.str._M_str = (char *)this;
  this_00 = (Ref *)cashew::Ref::operator[]((int)&name_local + 8);
  cVar1 = cashew::Ref::operator==(this_00,(IString *)&VAR);
  if (cVar1 != '\0') {
    RVar2 = makeRawArray(1);
    r = makeRawString((IString *)local_30);
    RVar2.inst = Value::push_back(RVar2.inst,r);
    cVar1 = cashew::Ref::operator!(&var_local);
    if (cVar1 == '\0') {
      Value::push_back(RVar2.inst,var_local);
    }
    puVar3 = (undefined8 *)cashew::Ref::operator[]((int)&name_local + 8);
    Value::push_back((Value *)*puVar3,RVar2);
    return;
  }
  __assert_fail("var[0] == VAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x688,"static void cashew::ValueBuilder::appendToVar(Ref, IString, Ref)");
}

Assistant:

static void appendToVar(Ref var, IString name, Ref value) {
    assert(var[0] == VAR);
    Ref array = &makeRawArray(1)->push_back(makeRawString(name));
    if (!!value) {
      array->push_back(value);
    }
    var[1]->push_back(array);
  }